

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_32x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar9 [16];
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  __m128i scaled_top_right3;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i top_right;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_90c;
  int local_8ec;
  undefined8 *local_7b8;
  byte local_758;
  undefined1 uStack_757;
  undefined1 uStack_756;
  undefined1 uStack_755;
  byte bStack_754;
  undefined1 uStack_753;
  undefined1 uStack_752;
  undefined1 uStack_751;
  ushort uStack_5c2;
  ushort uStack_5ba;
  ushort uStack_5a2;
  ushort uStack_59a;
  ushort uStack_582;
  ushort uStack_57a;
  ushort uStack_566;
  ushort uStack_564;
  ushort uStack_562;
  ushort uStack_55e;
  ushort uStack_55c;
  ushort uStack_55a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  int left_offset;
  __m128i round;
  __m128i scaled_top_right4;
  
  bVar2 = *(byte *)(in_RDX + 0x1f);
  uVar4 = (ushort)bVar2;
  uStack_566 = (ushort)bVar2;
  uStack_564 = (ushort)bVar2;
  uStack_562 = (ushort)bVar2;
  uStack_55e = (ushort)bVar2;
  uStack_55c = (ushort)bVar2;
  uStack_55a = (ushort)bVar2;
  uStack_582 = (ushort)bVar2;
  uStack_57a = (ushort)bVar2;
  uStack_5a2 = (ushort)bVar2;
  uStack_59a = (ushort)bVar2;
  uStack_5c2 = (ushort)bVar2;
  uStack_5ba = (ushort)bVar2;
  local_7b8 = in_RDI;
  for (local_8ec = 0; local_8ec < 0x40; local_8ec = local_8ec + 8) {
    uVar1 = *(undefined8 *)(in_RCX + local_8ec);
    local_758 = (byte)uVar1;
    uStack_757 = (undefined1)((ulong)uVar1 >> 8);
    uStack_756 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_755 = (undefined1)((ulong)uVar1 >> 0x18);
    bStack_754 = (byte)((ulong)uVar1 >> 0x20);
    uStack_753 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_752 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_751 = (undefined1)((ulong)uVar1 >> 0x38);
    for (local_90c = 0x1000100; local_90c < 0xf0e0f0f; local_90c = local_90c + 0x2020202) {
      auVar9._4_4_ = local_90c;
      auVar9._0_4_ = local_90c;
      auVar9._12_4_ = local_90c;
      auVar9._8_4_ = local_90c;
      auVar3[1] = 0;
      auVar3[0] = local_758;
      auVar3[2] = uStack_757;
      auVar3[3] = 0;
      auVar3[4] = uStack_756;
      auVar3[5] = 0;
      auVar3[6] = uStack_755;
      auVar3[7] = 0;
      auVar3[9] = 0;
      auVar3[8] = bStack_754;
      auVar3[10] = uStack_753;
      auVar3[0xb] = 0;
      auVar3[0xc] = uStack_752;
      auVar3[0xd] = 0;
      auVar3[0xe] = uStack_751;
      auVar3[0xf] = 0;
      auVar9 = pshufb(auVar3,auVar9);
      local_198 = auVar9._0_2_;
      sStack_196 = auVar9._2_2_;
      sStack_194 = auVar9._4_2_;
      sStack_192 = auVar9._6_2_;
      sStack_190 = auVar9._8_2_;
      sStack_18e = auVar9._10_2_;
      sStack_18c = auVar9._12_2_;
      sStack_18a = auVar9._14_2_;
      uVar5 = uVar4 + local_198 * 0xff + 0x80;
      uVar10 = uStack_566 * 0x10 + sStack_196 * 0xf0 + 0x80;
      uVar14 = uStack_564 * 0x1f + sStack_194 * 0xe1 + 0x80;
      uVar18 = uStack_562 * 0x2e + sStack_192 * 0xd2 + 0x80;
      uVar22 = uVar4 * 0x3c + sStack_190 * 0xc4 + 0x80;
      uVar26 = uStack_55e * 0x4a + sStack_18e * 0xb6 + 0x80;
      uVar30 = uStack_55c * 0x57 + sStack_18c * 0xa9 + 0x80;
      uVar34 = uStack_55a * 99 + sStack_18a * 0x9d + 0x80;
      uVar6 = uVar5 >> 8;
      uVar11 = uVar10 >> 8;
      uVar15 = uVar14 >> 8;
      uVar19 = uVar18 >> 8;
      uVar23 = uVar22 >> 8;
      uVar27 = uVar26 >> 8;
      uVar31 = uVar30 >> 8;
      uVar35 = uVar34 >> 8;
      uVar7 = uVar4 * 0x6f + local_198 * 0x91 + 0x80;
      uVar12 = uStack_566 * 0x7b + sStack_196 * 0x85 + 0x80;
      uVar16 = uStack_564 * 0x86 + sStack_194 * 0x7a + 0x80;
      uVar20 = uStack_582 * 0x91 + sStack_192 * 0x6f + 0x80;
      uVar24 = uVar4 * 0x9b + sStack_190 * 0x65 + 0x80;
      uVar28 = uStack_55e * 0xa4 + sStack_18e * 0x5c + 0x80;
      uVar32 = uStack_55c * 0xad + sStack_18c * 0x53 + 0x80;
      uVar36 = uStack_57a * 0xb6 + sStack_18a * 0x4a + 0x80;
      uVar8 = uVar7 >> 8;
      uVar13 = uVar12 >> 8;
      uVar17 = uVar16 >> 8;
      uVar21 = uVar20 >> 8;
      uVar25 = uVar24 >> 8;
      uVar29 = uVar28 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      *local_7b8 = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35)
                            ,CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                      (0xff < uVar31),
                                      CONCAT15((uVar27 != 0) * (uVar27 < 0x100) *
                                               (char)(uVar26 >> 8) - (0xff < uVar27),
                                               CONCAT14((uVar23 != 0) * (uVar23 < 0x100) *
                                                        (char)(uVar22 >> 8) - (0xff < uVar23),
                                                        CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                                 (char)(uVar18 >> 8) -
                                                                 (0xff < uVar19),
                                                                 CONCAT12((uVar15 != 0) *
                                                                          (uVar15 < 0x100) *
                                                                          (char)(uVar14 >> 8) -
                                                                          (0xff < uVar15),
                                                                          CONCAT11((uVar11 != 0) *
                                                                                   (uVar11 < 0x100)
                                                                                   * (char)(uVar10 
                                                  >> 8) - (0xff < uVar11),
                                                  (uVar6 != 0) * (uVar6 < 0x100) *
                                                  (char)(uVar5 >> 8) - (0xff < uVar6))))))));
      local_7b8[1] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                              (0xff < uVar37),
                              CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                       (0xff < uVar33),
                                       CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                                (char)(uVar28 >> 8) - (0xff < uVar29),
                                                CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                         (char)(uVar24 >> 8) - (0xff < uVar25),
                                                         CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                  (char)(uVar20 >> 8) -
                                                                  (0xff < uVar21),
                                                                  CONCAT12((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           CONCAT11((uVar13 != 0) *
                                                                                    (uVar13 < 0x100)
                                                                                    * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
      uVar5 = uVar4 * 0xbe + local_198 * 0x42 + 0x80;
      uVar10 = uStack_566 * 0xc5 + sStack_196 * 0x3b + 0x80;
      uVar14 = uStack_564 * 0xcc + sStack_194 * 0x34 + 0x80;
      uVar18 = uStack_5a2 * 0xd3 + sStack_192 * 0x2d + 0x80;
      uVar22 = uVar4 * 0xd9 + sStack_190 * 0x27 + 0x80;
      uVar26 = uStack_55e * 0xde + sStack_18e * 0x22 + 0x80;
      uVar30 = uStack_55c * 0xe3 + sStack_18c * 0x1d + 0x80;
      uVar34 = uStack_59a * 0xe7 + sStack_18a * 0x19 + 0x80;
      uVar6 = uVar5 >> 8;
      uVar11 = uVar10 >> 8;
      uVar15 = uVar14 >> 8;
      uVar19 = uVar18 >> 8;
      uVar23 = uVar22 >> 8;
      uVar27 = uVar26 >> 8;
      uVar31 = uVar30 >> 8;
      uVar35 = uVar34 >> 8;
      uVar7 = uVar4 * 0xeb + local_198 * 0x15 + 0x80;
      uVar12 = uStack_566 * 0xef + sStack_196 * 0x11 + 0x80;
      uVar16 = uStack_564 * 0xf2 + sStack_194 * 0xe + 0x80;
      uVar20 = uStack_5c2 * 0xf4 + sStack_192 * 0xc + 0x80;
      uVar24 = uVar4 * 0xf6 + sStack_190 * 10 + 0x80;
      uVar28 = uStack_55e * 0xf7 + sStack_18e * 9 + 0x80;
      uVar32 = uStack_55c * 0xf8 + sStack_18c * 8 + 0x80;
      uVar36 = uStack_5ba * 0xf8 + sStack_18a * 8 + 0x80;
      uVar8 = uVar7 >> 8;
      uVar13 = uVar12 >> 8;
      uVar17 = uVar16 >> 8;
      uVar21 = uVar20 >> 8;
      uVar25 = uVar24 >> 8;
      uVar29 = uVar28 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      local_7b8[2] = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                              (0xff < uVar35),
                              CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                       (0xff < uVar31),
                                       CONCAT15((uVar27 != 0) * (uVar27 < 0x100) *
                                                (char)(uVar26 >> 8) - (0xff < uVar27),
                                                CONCAT14((uVar23 != 0) * (uVar23 < 0x100) *
                                                         (char)(uVar22 >> 8) - (0xff < uVar23),
                                                         CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                                  (char)(uVar18 >> 8) -
                                                                  (0xff < uVar19),
                                                                  CONCAT12((uVar15 != 0) *
                                                                           (uVar15 < 0x100) *
                                                                           (char)(uVar14 >> 8) -
                                                                           (0xff < uVar15),
                                                                           CONCAT11((uVar11 != 0) *
                                                                                    (uVar11 < 0x100)
                                                                                    * (char)(uVar10 
                                                  >> 8) - (0xff < uVar11),
                                                  (uVar6 != 0) * (uVar6 < 0x100) *
                                                  (char)(uVar5 >> 8) - (0xff < uVar6))))))));
      local_7b8[3] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                              (0xff < uVar37),
                              CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                       (0xff < uVar33),
                                       CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                                (char)(uVar28 >> 8) - (0xff < uVar29),
                                                CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                         (char)(uVar24 >> 8) - (0xff < uVar25),
                                                         CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                  (char)(uVar20 >> 8) -
                                                                  (0xff < uVar21),
                                                                  CONCAT12((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           CONCAT11((uVar13 != 0) *
                                                                                    (uVar13 < 0x100)
                                                                                    * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
      local_7b8 = (undefined8 *)(in_RSI + (long)local_7b8);
    }
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_32x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3,
                                     weights4, scaled_top_right3,
                                     scaled_top_right4, round);
      dst += stride;
    }
  }
}